

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-arith-cwise.cc
# Opt level: O1

int __thiscall
dynet::CwiseMultiply::autobatch_sig(CwiseMultiply *this,ComputationGraph *cg,SigMap *sm)

{
  uint uVar1;
  uint *puVar2;
  pointer ppNVar3;
  Node *pNVar4;
  Node *pNVar5;
  int iVar6;
  int iVar7;
  Sig s;
  SigHash local_18;
  
  local_18.hash = -0x3361d2be;
  local_18.which = 0x13;
  puVar2 = (this->super_Node).args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppNVar3 = (cg->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar4 = ppNVar3[*puVar2];
  pNVar5 = ppNVar3[puVar2[1]];
  uVar1 = (pNVar4->dim).nd;
  iVar7 = 0;
  if ((uVar1 == (pNVar5->dim).nd) && (iVar7 = 0, (pNVar4->dim).bd == (pNVar5->dim).bd)) {
    iVar6 = bcmp(&pNVar4->dim,&pNVar5->dim,(ulong)uVar1);
    if (iVar6 == 0) {
      iVar7 = SigLinearSortedMap<dynet::SigHash>::get_idx(sm,&local_18);
    }
  }
  return iVar7;
}

Assistant:

int CwiseMultiply::autobatch_sig(const ComputationGraph & cg, SigMap &sm) const {
  // TODO: This does not handle the case where dimensions differ
  Sig s(nt::cmult);
  return cg.nodes[args[0]]->dim == cg.nodes[args[1]]->dim ? sm.get_idx(s) : 0;
}